

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O0

add_node_status_t
libtorrent::dht::replace_node_impl
          (node_entry *e,bucket_t *b,ip_set *ips,int bucket_index,int bucket_size_limit,
          bool last_bucket,dht_logger *log)

{
  ushort uVar1;
  ushort uVar2;
  rep rVar3;
  rep rVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  node_id nid;
  node_id nid_00;
  node_id nid_01;
  node_id nid_02;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  pointer pnVar14;
  reference pnVar15;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  *pvVar16;
  iterator iVar17;
  iterator iVar18;
  reference p_Var19;
  size_type sVar20;
  const_iterator __last;
  undefined8 uVar21;
  undefined8 uVar22;
  char *pcVar23;
  address *addr;
  span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  sVar24;
  span<const_char> in;
  address local_ec8;
  address local_ea8;
  undefined8 local_e88;
  undefined8 uStack_e80;
  uint local_e78;
  undefined8 local_e68;
  undefined8 uStack_e60;
  uint local_e58;
  address local_e48;
  string local_e28;
  aux *local_e08;
  char *local_e00;
  string local_df8;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  local_dd8 [2];
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  *local_dc8;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  *local_dc0;
  __normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  local_db8;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  *local_db0;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  *local_da8;
  __normal_iterator<const___gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  local_da0;
  __normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  local_d98;
  const_iterator local_d90;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  *local_d88;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  *n;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  *__end3;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  *__begin3;
  span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  *__range3;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  replace_candidates;
  __normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  local_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  uint local_d18;
  byte local_d09;
  iterator iStack_d08;
  uint8_t prefix;
  node_entry *local_d00;
  span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  local_ce8;
  undefined1 local_cd8 [8];
  span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
  nodes;
  array<std::vector<bucket_t::iterator>,_128> nodes_storage;
  undefined1 local_a8 [7];
  uint8_t to_add_prefix;
  address local_88;
  node_entry *local_60;
  node_entry *local_58;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  local_50;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  j;
  bool last_bucket_local;
  int bucket_size_limit_local;
  int bucket_index_local;
  ip_set *ips_local;
  bucket_t *b_local;
  node_entry *e_local;
  
  j._M_current._7_1_ = last_bucket;
  local_58 = (node_entry *)
             ::std::
             vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>::
             begin(&b->
                    super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                  );
  local_60 = (node_entry *)
             ::std::
             vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>::end
                       (&b->
                         super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                       );
  local_50 = ::std::
             max_element<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,libtorrent::dht::replace_node_impl(libtorrent::dht::node_entry_const&,libtorrent::aux::container_wrapper<libtorrent::dht::node_entry,int,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>&,libtorrent::dht::ip_set&,int,int,bool,libtorrent::dht::dht_logger*)::__0>
                       (local_58,local_60);
  pnVar14 = __gnu_cxx::
            __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
            ::operator->(&local_50);
  iVar11 = node_entry::fail_count(pnVar14);
  if (iVar11 < 1) {
    nid.m_number._M_elems[3] = (int)((ulong)*(undefined8 *)((e->id).m_number._M_elems + 2) >> 0x20);
    nid.m_number._M_elems._0_12_ = *(undefined1 (*) [12])(e->id).m_number._M_elems;
    nid.m_number._M_elems[4] = (e->id).m_number._M_elems[4];
    bVar8 = classify_prefix(bucket_index,(bool)(j._M_current._7_1_ & 1),bucket_size_limit,nid);
    libtorrent::aux::
    container_wrapper<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_long,_std::array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>_>
    ::container_wrapper((container_wrapper<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_long,_std::array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>_>
                         *)&nodes.m_len);
    span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>
    ::
    span<libtorrent::aux::container_wrapper<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>,long,std::array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>,128ul>>,std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>,void>
              ((span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>
                *)&local_ce8,
               (container_wrapper<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_long,_std::array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>_>
                *)&nodes.m_len);
    sVar24 = span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
             ::first(&local_ce8,(long)bucket_size_limit);
    nodes.m_ptr = (vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                   *)sVar24.m_len;
    __last._M_current =
         (__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
          *)sVar24.m_ptr;
    local_cd8 = (undefined1  [8])__last._M_current;
    local_d00 = (node_entry *)
                ::std::
                vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>::
                begin(&b->
                       super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                     );
    local_50._M_current = local_d00;
    while( true ) {
      iStack_d08 = ::std::
                   vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                   ::end(&b->
                          super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                        );
      bVar9 = __gnu_cxx::operator!=(&local_50,&stack0xfffffffffffff2f8);
      bVar10 = j._M_current._7_1_;
      if (!bVar9) break;
      pnVar14 = __gnu_cxx::
                __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                ::operator->(&local_50);
      local_d18 = (pnVar14->id).m_number._M_elems[4];
      local_d28 = *(undefined8 *)(pnVar14->id).m_number._M_elems;
      uStack_d20 = *(undefined8 *)((pnVar14->id).m_number._M_elems + 2);
      __last._M_current =
           (__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
            *)(ulong)local_d18;
      nid_00.m_number._M_elems[3] = (int)((ulong)uStack_d20 >> 0x20);
      nid_00.m_number._M_elems._0_12_ = *(undefined1 (*) [12])(pnVar14->id).m_number._M_elems;
      nid_00.m_number._M_elems[4] = local_d18;
      local_d09 = classify_prefix(bucket_index,(bool)(bVar10 & 1),bucket_size_limit,nid_00);
      pvVar16 = span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                ::operator[]((span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                              *)local_cd8,(ulong)local_d09);
      ::std::
      vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ::push_back(pvVar16,&local_50);
      __gnu_cxx::
      __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
      ::operator++(&local_50);
    }
    pvVar16 = span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
              ::operator[]((span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                            *)local_cd8,(ulong)bVar8);
    bVar9 = ::std::
            vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
            ::empty(pvVar16);
    if (bVar9) {
      ::std::
      vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ::vector((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                *)&__range3);
      __begin3 = (vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                  *)local_cd8;
      __end3 = span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
               ::begin((span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                        *)__begin3);
      n = span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
          ::end((span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                 *)__begin3);
      for (; __end3 != n; __end3 = __end3 + 1) {
        local_d88 = __end3;
        sVar20 = ::std::
                 vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                 ::size(__end3);
        if (1 < sVar20) {
          local_d98._M_current =
               (__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                *)::std::
                  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                  ::end((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                         *)&__range3);
          __gnu_cxx::
          __normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>const*,std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>
          ::
          __normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>*>
                    ((__normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>const*,std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>
                      *)&local_d90,&local_d98);
          local_da0._M_current =
               (__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                *)::std::
                  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                  ::begin(local_d88);
          __last = ::std::
                   vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                   ::end(local_d88);
          local_da8 = (__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                       *)__last;
          local_db0 = (__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                       *)::std::
                         vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
                         ::
                         insert<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>const*,std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>,void>
                                   ((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
                                     *)&__range3,local_d90,local_da0,
                                    (__normal_iterator<const___gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                                     )__last._M_current);
        }
      }
      local_dc0 = (__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                   *)::std::
                     vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                     ::begin((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                              *)&__range3);
      local_dc8 = (__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                   *)::std::
                     vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                     ::end((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                            *)&__range3);
      local_db8 = ::std::
                  max_element<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>*,std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>,libtorrent::dht::replace_node_impl(libtorrent::dht::node_entry_const&,libtorrent::aux::container_wrapper<libtorrent::dht::node_entry,int,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>&,libtorrent::dht::ip_set&,int,int,bool,libtorrent::dht::dht_logger*)::__2>
                            (local_dc0,local_dc8);
      p_Var19 = __gnu_cxx::
                __normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                ::operator*(&local_db8);
      local_50._M_current = p_Var19->_M_current;
      ::std::
      vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ::~vector((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                 *)&__range3);
    }
    else {
      pvVar16 = span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                ::operator[]((span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                              *)local_cd8,(ulong)bVar8);
      iVar17 = ::std::
               vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
               ::begin(pvVar16);
      pvVar16 = span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                ::operator[]((span<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                              *)local_cd8,(ulong)bVar8);
      iVar18 = ::std::
               vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
               ::end(pvVar16);
      local_d30 = ::std::
                  max_element<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>*,std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>,libtorrent::dht::replace_node_impl(libtorrent::dht::node_entry_const&,libtorrent::aux::container_wrapper<libtorrent::dht::node_entry,int,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>&,libtorrent::dht::ip_set&,int,int,bool,libtorrent::dht::dht_logger*)::__1>
                            (iVar17._M_current,iVar18._M_current);
      p_Var19 = __gnu_cxx::
                __normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>_>
                ::operator*(&local_d30);
      local_50._M_current = p_Var19->_M_current;
      pnVar15 = __gnu_cxx::
                __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                ::operator*(&local_50);
      bVar9 = node_entry::operator<(e,pnVar15);
      if (!bVar9) {
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)::std::
                      vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                      ::end(&b->
                             super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                           );
        local_50._M_current =
             (node_entry *)
             replace_candidates.
             super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
    }
    local_dd8[0]._M_current =
         (node_entry *)
         ::std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>::
         end(&b->
              super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
            );
    bVar9 = __gnu_cxx::operator!=(&local_50,local_dd8);
    if (bVar9) {
      if ((log != (dht_logger *)0x0) &&
         (uVar12 = (**log->_vptr_dht_logger)(log,2), (uVar12 & 1) != 0)) {
        span<char_const>::span<libtorrent::digest32<160l>,char,void>
                  ((span<char_const> *)&local_e08,&e->id);
        in.m_len = (difference_type)__last._M_current;
        in.m_ptr = local_e00;
        libtorrent::aux::to_hex_abi_cxx11_(&local_df8,local_e08,in);
        uVar21 = ::std::__cxx11::string::c_str();
        node_entry::addr(&local_e48,e);
        libtorrent::aux::print_address_abi_cxx11_(&local_e28,(aux *)&local_e48,addr);
        uVar22 = ::std::__cxx11::string::c_str();
        pcVar23 = "not-verified";
        if ((e->verified & 1U) != 0) {
          pcVar23 = "verified";
        }
        uVar1 = e->rtt;
        local_e58 = (e->id).m_number._M_elems[4];
        local_e68 = *(undefined8 *)(e->id).m_number._M_elems;
        uStack_e60 = *(undefined8 *)((e->id).m_number._M_elems + 2);
        nid_01.m_number._M_elems[3] = (int)((ulong)uStack_e60 >> 0x20);
        nid_01.m_number._M_elems._0_12_ = *(undefined1 (*) [12])(e->id).m_number._M_elems;
        nid_01.m_number._M_elems[4] = local_e58;
        bVar8 = classify_prefix(bucket_index,(bool)(j._M_current._7_1_ & 1),bucket_size_limit,nid_01
                               );
        pnVar14 = __gnu_cxx::
                  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                  ::operator->(&local_50);
        uVar13 = 0x883338;
        if ((pnVar14->verified & 1U) != 0) {
          uVar13 = 0x88333c;
        }
        pnVar14 = __gnu_cxx::
                  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                  ::operator->(&local_50);
        bVar10 = j._M_current._7_1_;
        uVar2 = pnVar14->rtt;
        pnVar14 = __gnu_cxx::
                  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                  ::operator->(&local_50);
        local_e78 = (pnVar14->id).m_number._M_elems[4];
        local_e88 = *(undefined8 *)(pnVar14->id).m_number._M_elems;
        uStack_e80 = *(undefined8 *)((pnVar14->id).m_number._M_elems + 2);
        nid_02.m_number._M_elems[3] = (int)((ulong)uStack_e80 >> 0x20);
        nid_02.m_number._M_elems._0_12_ = *(undefined1 (*) [12])(pnVar14->id).m_number._M_elems;
        nid_02.m_number._M_elems[4] = local_e78;
        bVar10 = classify_prefix(bucket_index,(bool)(bVar10 & 1),bucket_size_limit,nid_02);
        (*log->_vptr_dht_logger[1])
                  (log,2,"replacing node with better one: %s %s [%s %dms %d] vs. [%s %dms %d]",
                   uVar21,uVar22,pcVar23,(uint)uVar1,(uint)bVar8,uVar13,(uint)uVar2,(uint)bVar10);
        ::std::__cxx11::string::~string((string *)&local_e28);
        ::std::__cxx11::string::~string((string *)&local_df8);
      }
      pnVar14 = __gnu_cxx::
                __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                ::operator->(&local_50);
      node_entry::addr(&local_ea8,pnVar14);
      ip_set::erase(ips,&local_ea8);
      pnVar15 = __gnu_cxx::
                __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                ::operator*(&local_50);
      rVar3 = (e->first_seen).__d.__r;
      rVar4 = (e->last_queried).__d.__r;
      uVar21 = *(undefined8 *)(e->id).m_number._M_elems;
      uVar22 = *(undefined8 *)((e->id).m_number._M_elems + 2);
      uVar5 = *(undefined8 *)((e->id).m_number._M_elems + 4);
      uVar6 = *(undefined8 *)((long)&(e->endpoint).addr.addr + 4);
      uVar7 = *(undefined8 *)&(e->endpoint).addr.field_0x10;
      *(undefined8 *)((long)&(pnVar15->endpoint).addr.addr + 8) =
           *(undefined8 *)((long)&(e->endpoint).addr.addr + 8);
      *(undefined8 *)&(pnVar15->endpoint).addr.field_0x10 = uVar7;
      *(undefined8 *)((pnVar15->id).m_number._M_elems + 4) = uVar5;
      *(undefined8 *)((long)&(pnVar15->endpoint).addr.addr + 4) = uVar6;
      *(undefined8 *)(pnVar15->id).m_number._M_elems = uVar21;
      *(undefined8 *)((pnVar15->id).m_number._M_elems + 2) = uVar22;
      (pnVar15->first_seen).__d.__r = rVar3;
      (pnVar15->last_queried).__d.__r = rVar4;
      node_entry::addr(&local_ec8,e);
      ip_set::insert(ips,&local_ec8);
      e_local._4_4_ = node_added;
    }
    else {
      e_local._4_4_ = need_bucket_split;
    }
    libtorrent::aux::
    container_wrapper<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_long,_std::array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>_>
    ::~container_wrapper
              ((container_wrapper<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_long,_std::array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>_>
                *)&nodes.m_len);
  }
  else {
    pnVar14 = __gnu_cxx::
              __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
              ::operator->(&local_50);
    node_entry::addr(&local_88,pnVar14);
    ip_set::erase(ips,&local_88);
    pnVar15 = __gnu_cxx::
              __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
              ::operator*(&local_50);
    memcpy(pnVar15,e,0x3c);
    node_entry::addr((address *)local_a8,e);
    ip_set::insert(ips,(address *)local_a8);
    e_local._4_4_ = node_added;
  }
  return e_local._4_4_;
}

Assistant:

routing_table::add_node_status_t replace_node_impl(node_entry const& e
	, bucket_t& b, ip_set& ips, int const bucket_index
	, int const bucket_size_limit, bool const last_bucket
#ifndef TORRENT_DISABLE_LOGGING
	, dht_logger* log
#endif
	)
{
	// if the bucket isn't full, we're not replacing anything, and this function
	// should not have been called
	TORRENT_ASSERT(int(b.size()) >= bucket_size_limit);

	auto j = std::max_element(b.begin(), b.end()
		, [](node_entry const& lhs, node_entry const& rhs)
		{ return lhs.fail_count() < rhs.fail_count(); });
	TORRENT_ASSERT(j != b.end());

	if (j->fail_count() > 0)
	{
		// i points to a node that has been marked
		// as stale. Replace it with this new one
		ips.erase(j->addr());
		*j = e;
		ips.insert(e.addr());
		return routing_table::node_added;
	}

	// then we look for nodes with the same 3 bit prefix (or however
	// many bits prefix the bucket size warrants). If there is no other
	// node with this prefix, remove the duplicate with the highest RTT.
	// as the last replacement strategy, if the node we found matching our
	// bit prefix has higher RTT than the new node, replace it.

	// in order to provide as few lookups as possible before finding
	// the data someone is looking for, make sure there is an affinity
	// towards having a good spread of node IDs in each bucket
	std::uint8_t const to_add_prefix = classify_prefix(bucket_index
		, last_bucket, bucket_size_limit, e.id);

	// nodes organized by their prefix
	aux::array<std::vector<bucket_t::iterator>, 128> nodes_storage;
	auto const nodes = span<std::vector<bucket_t::iterator>>{nodes_storage}.first(bucket_size_limit);

	for (j = b.begin(); j != b.end(); ++j)
	{
		std::uint8_t const prefix = classify_prefix(
			bucket_index, last_bucket, bucket_size_limit, j->id);
		TORRENT_ASSERT(prefix < nodes.size());
		nodes[prefix].push_back(j);
	}

	if (!nodes[to_add_prefix].empty())
	{
		j = *std::max_element(nodes[to_add_prefix].begin(), nodes[to_add_prefix].end()
			, [](bucket_t::iterator lhs, bucket_t::iterator rhs)
			{ return *lhs < *rhs; });

		// only if e is better than the worst node in this prefix slot do we
		// replace it. resetting j means we're not replacing it
		if (!(e < *j)) j = b.end();
	}
	else
	{
		// there is no node in this prefix slot. We definitely want to add it.
		// Now we just need to figure out which one to replace
		std::vector<bucket_t::iterator> replace_candidates;
		for (auto const& n : nodes)
		{
			if (n.size() > 1) replace_candidates.insert(replace_candidates.end(), n.begin(), n.end());
		}

		// since the bucket is full, and there's no node in the prefix-slot
		// we're about to add to, there must be at least one prefix slot that
		// has more than one node.
		TORRENT_ASSERT(!replace_candidates.empty());

		// from these nodes, pick the "worst" one and replace it
		j = *std::max_element(replace_candidates.begin(), replace_candidates.end()
			, [](bucket_t::iterator lhs, bucket_t::iterator rhs)
			{ return *lhs < *rhs; });
	}

	if (j != b.end())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (log != nullptr && log->should_log(dht_logger::routing_table))
		{
			log->log(dht_logger::routing_table, "replacing node with better one: %s %s [%s %dms %d] vs. [%s %dms %d]"
				, aux::to_hex(e.id).c_str(), aux::print_address(e.addr()).c_str()
				, e.verified ? "verified" : "not-verified", e.rtt
				, classify_prefix(bucket_index, last_bucket, bucket_size_limit, e.id)
				, j->verified ? "verified" : "not-verified", j->rtt
				, classify_prefix(bucket_index, last_bucket, bucket_size_limit, j->id)
				);
		}
#endif
		ips.erase(j->addr());
		*j = e;
		ips.insert(e.addr());
		return routing_table::node_added;
	}
	return routing_table::need_bucket_split;
}